

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O3

void pputrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  int __fd;
  ssize_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uchar c;
  undefined1 local_45;
  uint local_44;
  ulong local_40;
  long local_38;
  
  local_44 = sx;
  __fd = creat(fn,0x180);
  if (__fd < 1) {
LAB_00102798:
    pputrast_cold_1();
  }
  else {
    sVar1 = write(__fd,hd,0x20);
    if (sVar1 == 0x20) {
      if (0 < sy) {
        local_40 = (ulong)(uint)sy;
        uVar2 = (ulong)local_44;
        local_38 = (long)r << 2;
        uVar4 = 0;
        do {
          if (0 < (int)local_44) {
            uVar3 = 0;
            do {
              local_45 = (undefined1)(int)bf[uVar3];
              sVar1 = write(__fd,&local_45,1);
              if (sVar1 != 1) {
                pputrast_cold_3();
                goto LAB_00102798;
              }
              uVar3 = uVar3 + 1;
            } while (uVar2 != uVar3);
          }
          uVar4 = uVar4 + 1;
          bf = (float *)((long)bf + local_38);
        } while (uVar4 != local_40);
      }
      close(__fd);
      return;
    }
  }
  pputrast_cold_2();
  return;
}

Assistant:

void pputrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[N1*N1] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    if (write(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          c = (unsigned char)bf[r*i + j] ;
          if (write(fd,&c,sizeof(c)) != 1) {
            error(8) ;
          }
        }
      }
    }
    else {
      error(9) ;
    }
  }
  else {
    error(10) ;
  }
  close(fd) ;
}